

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

void * __thiscall QCoreApplication::resolveInterface(QCoreApplication *this,char *name,int revision)

{
  return (void *)0x0;
}

Assistant:

void *QCoreApplication::resolveInterface(const char *name, int revision) const
{
#if defined(Q_OS_ANDROID)
    // The QAndroidApplication is wrongly using static methods for
    // its native interface (QTBUG-128796). Until we fix that we at
    // least want the preferred way of resolving a native interface
    // to work, so provide a minimal subclass of the interface.
    using namespace QNativeInterface;
    struct AndroidApplication : public QAndroidApplication {};
    static AndroidApplication androidApplication;
    QT_NATIVE_INTERFACE_RETURN_IF(QAndroidApplication, &androidApplication);
#endif
    Q_UNUSED(name); Q_UNUSED(revision);
    return nullptr;
}